

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<int>(string *__return_storage_ptr__,int *arg)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  string *__str;
  uint __len;
  
  uVar1 = *arg;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_0011ddfa;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_0011ddfa;
      }
      if (uVar3 < 10000) goto LAB_0011ddfa;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_0011ddfa:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg)
{
    return std::to_string(arg);
}